

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O3

void getmaxdepth(btDbvtNode *node,int depth,int *maxdepth)

{
  btDbvtNode *pbVar1;
  
  pbVar1 = (node->field_2).childs[1];
  while (pbVar1 != (btDbvtNode *)0x0) {
    depth = depth + 1;
    getmaxdepth((node->field_2).childs[0],depth,maxdepth);
    node = (node->field_2).childs[1];
    pbVar1 = (node->field_2).childs[1];
  }
  if (depth < *maxdepth) {
    depth = *maxdepth;
  }
  *maxdepth = depth;
  return;
}

Assistant:

static void						getmaxdepth(const btDbvtNode* node,int depth,int& maxdepth)
{
	if(node->isinternal())
	{
		getmaxdepth(node->childs[0],depth+1,maxdepth);
		getmaxdepth(node->childs[1],depth+1,maxdepth);
	} else maxdepth=btMax(maxdepth,depth);
}